

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_open2.c
# Opt level: O0

void test_archive_read_open2(void)

{
  char *no_formats;
  char *no_reader;
  
  test(1,(undefined1 *)0x0,(archive_read_callback *)0x0,(archive_skip_callback *)0x0,
       (undefined1 *)0x0,-0x1e,"No reader function provided to archive_read_open");
  test(1,open_cb,(archive_read_callback *)0x0,(archive_skip_callback *)0x0,(undefined1 *)0x0,-0x1e,
       "No reader function provided to archive_read_open");
  test(1,open_cb,read_cb,(archive_skip_callback *)0x0,(undefined1 *)0x0,0,(char *)0x0);
  test(1,open_cb,read_cb,skip_cb,(undefined1 *)0x0,0,(char *)0x0);
  test(1,open_cb,read_cb,skip_cb,close_cb,0,(char *)0x0);
  test(1,(undefined1 *)0x0,read_cb,skip_cb,close_cb,0,(char *)0x0);
  test(1,open_cb,read_cb,skip_cb,(undefined1 *)0x0,0,(char *)0x0);
  test(1,(undefined1 *)0x0,read_cb,skip_cb,(undefined1 *)0x0,0,(char *)0x0);
  test(1,(undefined1 *)0x0,read_cb,(archive_skip_callback *)0x0,(undefined1 *)0x0,0,(char *)0x0);
  test(0,(undefined1 *)0x0,(archive_read_callback *)0x0,(archive_skip_callback *)0x0,
       (undefined1 *)0x0,-0x1e,"No reader function provided to archive_read_open");
  test(0,open_cb,(archive_read_callback *)0x0,(archive_skip_callback *)0x0,(undefined1 *)0x0,-0x1e,
       "No reader function provided to archive_read_open");
  test(0,open_cb,read_cb,(archive_skip_callback *)0x0,(undefined1 *)0x0,-0x1e,
       "No formats registered");
  test(0,open_cb,read_cb,skip_cb,(undefined1 *)0x0,-0x1e,"No formats registered");
  test(0,open_cb,read_cb,skip_cb,close_cb,-0x1e,"No formats registered");
  return;
}

Assistant:

DEFINE_TEST(test_archive_read_open2)
{
	const char *no_reader =
	    "No reader function provided to archive_read_open";
	const char *no_formats = "No formats registered";

	test(1, NULL, NULL, NULL, NULL,
	    ARCHIVE_FATAL, no_reader);
	test(1, open_cb, NULL, NULL, NULL,
	    ARCHIVE_FATAL, no_reader);
	test(1, open_cb, read_cb, NULL, NULL,
	    ARCHIVE_OK, NULL);
	test(1, open_cb, read_cb, skip_cb, NULL,
	    ARCHIVE_OK, NULL);
	test(1, open_cb, read_cb, skip_cb, close_cb,
	    ARCHIVE_OK, NULL);
	test(1, NULL, read_cb, skip_cb, close_cb,
	    ARCHIVE_OK, NULL);
	test(1, open_cb, read_cb, skip_cb, NULL,
	    ARCHIVE_OK, NULL);
	test(1, NULL, read_cb, skip_cb, NULL,
	    ARCHIVE_OK, NULL);
	test(1, NULL, read_cb, NULL, NULL,
	    ARCHIVE_OK, NULL);

	test(0, NULL, NULL, NULL, NULL,
	    ARCHIVE_FATAL, no_reader);
	test(0, open_cb, NULL, NULL, NULL,
	    ARCHIVE_FATAL, no_reader);
	test(0, open_cb, read_cb, NULL, NULL,
	    ARCHIVE_FATAL, no_formats);
	test(0, open_cb, read_cb, skip_cb, NULL,
	    ARCHIVE_FATAL, no_formats);
	test(0, open_cb, read_cb, skip_cb, close_cb,
	    ARCHIVE_FATAL, no_formats);
}